

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O2

void __thiscall wasm::InstrumentLocals::visitLocalGet(InstrumentLocals *this,LocalGet *curr)

{
  Type *this_00;
  Index x;
  Name target;
  uint line;
  bool bVar1;
  BasicType BVar2;
  HeapType HVar3;
  size_t *psVar4;
  Call *expression;
  char *pcVar5;
  initializer_list<wasm::Expression_*> __l;
  Const *local_80;
  Const *local_78;
  LocalGet *local_70;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Builder local_50;
  Builder builder;
  size_t local_40;
  char *local_38;
  
  local_50.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
       ).super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.
       super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.currModule
  ;
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type;
  bVar1 = wasm::Type::isRef(this_00);
  if (bVar1) {
    HVar3 = wasm::Type::getHeapType(this_00);
    if (HVar3.id == 0) {
      bVar1 = wasm::Type::isNullable(this_00);
      if (bVar1) {
        psVar4 = &get_externref;
        goto LAB_00889a9d;
      }
    }
    else if ((HVar3.id == 1) && (bVar1 = wasm::Type::isNullable(this_00), bVar1)) {
      psVar4 = &get_funcref;
      goto LAB_00889a9d;
    }
    pcVar5 = "TODO: general reference types";
    line = 0x51;
LAB_00889b5e:
    handle_unreachable(pcVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                       ,line);
  }
  bVar1 = wasm::Type::isTuple(this_00);
  if (bVar1) {
    pcVar5 = "!curr->type.isTuple() && \"Unexpected tuple type\"";
LAB_00889b74:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                  ,0x54,"void wasm::InstrumentLocals::visitLocalGet(LocalGet *)");
  }
  if (6 < this_00->id) {
    pcVar5 = "curr->type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00889b74;
  }
  BVar2 = wasm::Type::getBasic(this_00);
  switch(BVar2) {
  case none:
  case unreachable:
    pcVar5 = "unexpected type";
    line = 0x66;
    goto LAB_00889b5e;
  case i32:
    psVar4 = &get_i32;
    break;
  case i64:
    goto switchD_00889a60_caseD_3;
  case f32:
    psVar4 = &get_f32;
    break;
  case f64:
    psVar4 = &get_f64;
    break;
  case v128:
    psVar4 = &get_v128;
    break;
  default:
    local_38 = (char *)0x0;
    local_40 = 0;
    goto LAB_00889aac;
  }
LAB_00889a9d:
  local_40 = *psVar4;
  local_38 = (char *)psVar4[1];
LAB_00889aac:
  x = this->id;
  this->id = x + 1;
  local_80 = Builder::makeConst<int>(&local_50,x);
  local_78 = Builder::makeConst<int>(&local_50,curr->index);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_80;
  local_70 = curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_68,__l,
             (allocator_type *)((long)&builder.wasm + 7));
  target.super_IString.str._M_str = local_38;
  target.super_IString.str._M_len = local_40;
  expression = Builder::makeCall(&local_50,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &local_68,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                       super_Expression.type.id,false);
  Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
              ).
              super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
              .super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>,
             (Expression *)expression);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_68);
switchD_00889a60_caseD_3:
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    Builder builder(*getModule());
    Name import;
    if (curr->type.isRef()) {
      auto heapType = curr->type.getHeapType();
      if (heapType == HeapType::func && curr->type.isNullable()) {
        import = get_funcref;
      } else if (heapType == HeapType::ext && curr->type.isNullable()) {
        import = get_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->type);
      switch (curr->type.getBasic()) {
        case Type::i32:
          import = get_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = get_f32;
          break;
        case Type::f64:
          import = get_f64;
          break;
        case Type::v128:
          import = get_v128;
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    replaceCurrent(builder.makeCall(import,
                                    {builder.makeConst(int32_t(id++)),
                                     builder.makeConst(int32_t(curr->index)),
                                     curr},
                                    curr->type));
  }